

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetwork::InternalSwap(NeuralNetwork *this,NeuralNetwork *other)

{
  int iVar1;
  NetworkUpdateParameters *pNVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->layers_).super_RepeatedPtrFieldBase,
             &(other->layers_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(other->preprocessing_).super_RepeatedPtrFieldBase);
  pNVar2 = this->updateparams_;
  this->updateparams_ = other->updateparams_;
  other->updateparams_ = pNVar2;
  iVar1 = this->arrayinputshapemapping_;
  this->arrayinputshapemapping_ = other->arrayinputshapemapping_;
  other->arrayinputshapemapping_ = iVar1;
  iVar1 = this->imageinputshapemapping_;
  this->imageinputshapemapping_ = other->imageinputshapemapping_;
  other->imageinputshapemapping_ = iVar1;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void NeuralNetwork::InternalSwap(NeuralNetwork* other) {
  layers_.InternalSwap(&other->layers_);
  preprocessing_.InternalSwap(&other->preprocessing_);
  std::swap(updateparams_, other->updateparams_);
  std::swap(arrayinputshapemapping_, other->arrayinputshapemapping_);
  std::swap(imageinputshapemapping_, other->imageinputshapemapping_);
  std::swap(_cached_size_, other->_cached_size_);
}